

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cpp
# Opt level: O0

TestReturnValue __thiscall
embree::DisableAndDetachGeometryTest::run
          (DisableAndDetachGeometryTest *this,VerifyApplication *state,bool silent)

{
  undefined8 uVar1;
  RTCDevice pRVar2;
  VerifyScene *this_00;
  RandomSampler *pRVar3;
  RTCScene pRVar4;
  RTCScene pRVar5;
  ostream *poVar6;
  byte in_DL;
  long in_RDI;
  bool bVar7;
  bool bVar8;
  float fVar9;
  bool ok3;
  bool ok2;
  bool ok1;
  bool ok0;
  RTCRayHit ray3;
  RTCRayHit ray2;
  RTCRayHit ray1;
  RTCRayHit ray0;
  size_t i_8;
  bool allOk;
  size_t j;
  RTCGeometry hgeom [4];
  uint geom [4];
  VerifyScene scene;
  RTCDeviceRef device;
  string cfg;
  uint l_7;
  uint l_5;
  uint l_3;
  uint l_1;
  uint l;
  uint l_2;
  uint l_4;
  uint l_6;
  size_t i_7;
  size_t i_3;
  size_t i_6;
  size_t i_2;
  size_t i_5;
  size_t i_1;
  size_t i_4;
  size_t i;
  pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> *this_01;
  VerifyScene *this_02;
  RTCDeviceRef *in_stack_fffffffffffff4a0;
  undefined4 in_stack_fffffffffffff4a8;
  undefined1 in_stack_fffffffffffff4ac;
  undefined1 in_stack_fffffffffffff4ad;
  undefined1 in_stack_fffffffffffff4ae;
  undefined1 in_stack_fffffffffffff4af;
  SceneFlags in_stack_fffffffffffff4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4b8;
  RTCDevice in_stack_fffffffffffff4d0;
  undefined8 in_stack_fffffffffffff4f8;
  int sse2;
  size_t in_stack_fffffffffffff538;
  undefined8 in_stack_fffffffffffff540;
  Vec3fa *in_stack_fffffffffffff548;
  size_t in_stack_fffffffffffff550;
  undefined1 *puVar10;
  RandomSampler *in_stack_fffffffffffff558;
  VerifyScene *in_stack_fffffffffffff560;
  undefined8 in_stack_fffffffffffff568;
  RTCBuildQuality quality;
  pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> *ppVar11;
  undefined8 in_stack_fffffffffffff570;
  float level;
  size_t in_stack_fffffffffffff578;
  long lVar12;
  long lVar13;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined4 local_a18;
  undefined4 local_a14;
  undefined4 in_stack_fffffffffffff5f0;
  undefined4 in_stack_fffffffffffff5f4;
  undefined4 in_stack_fffffffffffff5f8;
  undefined4 in_stack_fffffffffffff5fc;
  char *in_stack_fffffffffffff640;
  undefined1 local_9b8 [4];
  RTCError in_stack_fffffffffffff64c;
  void *in_stack_fffffffffffff650;
  undefined8 local_9a8;
  size_t in_stack_fffffffffffff660;
  undefined4 in_stack_fffffffffffff668;
  undefined4 in_stack_fffffffffffff66c;
  undefined4 in_stack_fffffffffffff670;
  undefined4 in_stack_fffffffffffff674;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined4 local_918;
  undefined4 local_914;
  undefined4 local_910;
  undefined4 local_90c;
  undefined4 local_908;
  undefined4 local_904;
  undefined4 local_900;
  undefined4 local_8fc;
  float local_8f8;
  undefined4 local_8f4;
  undefined4 local_8d4;
  int local_8d0;
  undefined4 uStack_8cc;
  undefined4 uStack_8c8;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined4 local_898;
  undefined4 local_894;
  undefined4 local_890;
  undefined4 local_88c;
  undefined4 local_888;
  undefined4 local_884;
  undefined4 local_880;
  undefined4 local_87c;
  float local_878;
  undefined4 local_874;
  undefined4 local_854;
  int local_850;
  undefined4 uStack_84c;
  undefined4 uStack_848;
  ulong local_830;
  byte local_821;
  ulong local_820;
  undefined8 local_818 [4];
  pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> local_7f8;
  undefined8 local_7e8;
  undefined8 local_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  uint local_7c8;
  VerifyScene local_7b8;
  undefined1 local_778 [8];
  ulong local_770;
  undefined8 local_768;
  undefined8 local_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined4 local_748;
  undefined1 local_738 [8];
  ulong local_730;
  undefined8 local_728;
  undefined8 local_720;
  undefined8 local_718;
  undefined8 uStack_710;
  uint local_708;
  RandomSampler local_6f8;
  undefined4 local_6f4;
  undefined4 local_6f0;
  RandomSampler local_6ec;
  undefined8 local_6e0;
  VerifyScene local_6d8;
  RTCDeviceRef local_698 [3];
  string local_680 [32];
  string local_660 [32];
  string local_640 [39];
  byte local_619;
  TestReturnValue local_608;
  undefined4 local_604;
  undefined4 local_600;
  undefined4 local_5fc;
  undefined8 *local_5f8;
  undefined4 local_5ec;
  undefined4 local_5e8;
  undefined4 local_5e4;
  undefined8 *local_5e0;
  undefined4 local_5d4;
  undefined4 local_5d0;
  undefined4 local_5cc;
  long local_5c8;
  undefined4 local_5bc;
  undefined4 local_5b8;
  undefined4 local_5b4;
  undefined8 *local_5b0;
  undefined4 local_5a4;
  undefined4 local_5a0;
  undefined4 local_59c;
  undefined8 *local_598;
  undefined4 local_58c;
  undefined4 local_588;
  undefined4 local_584;
  undefined8 *local_580;
  undefined4 local_574;
  undefined4 local_570;
  undefined4 local_56c;
  undefined8 *local_568;
  undefined4 local_55c;
  undefined4 local_558;
  undefined4 local_554;
  undefined8 *local_550;
  undefined4 local_544;
  undefined4 local_540;
  undefined4 local_53c;
  undefined8 *local_538;
  undefined4 local_52c;
  undefined4 local_528;
  undefined4 local_524;
  undefined1 *local_520;
  undefined4 local_514;
  undefined4 local_510;
  undefined4 local_50c;
  undefined8 *local_508;
  undefined4 local_4fc;
  undefined4 local_4f8;
  undefined4 local_4f4;
  undefined8 *local_4f0;
  int local_4e4;
  undefined8 *local_4e0;
  undefined8 *local_4d8;
  undefined1 *local_4d0;
  int local_4c4;
  undefined1 *local_4c0;
  undefined8 *local_4b8;
  undefined1 *local_4b0;
  int local_4a4;
  undefined8 *local_4a0;
  undefined8 *local_498;
  undefined1 *local_490;
  int local_484;
  undefined8 *local_480;
  undefined8 *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> *local_450;
  pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> *local_448;
  undefined1 *local_438;
  undefined1 *local_428;
  undefined1 *local_418;
  int local_404;
  undefined4 *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  int local_3e4;
  undefined4 *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  int local_3c4;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  int local_3a4;
  undefined4 *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined4 local_2b8;
  undefined4 local_2b4;
  undefined4 local_2b0;
  undefined4 local_2ac;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined4 local_298;
  undefined4 local_294;
  undefined4 local_290;
  undefined4 local_28c;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined4 local_278;
  undefined4 local_274;
  undefined4 local_270;
  undefined4 local_26c;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined4 local_258;
  undefined4 local_254;
  undefined4 local_250;
  undefined4 local_24c;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined4 local_238;
  undefined4 local_234;
  undefined4 local_230;
  undefined4 local_22c;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined4 local_218;
  undefined4 local_214;
  undefined4 local_210;
  undefined4 local_20c;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined4 local_1f8;
  undefined4 local_1f4;
  undefined4 local_1f0;
  undefined4 local_1ec;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined4 local_1cc;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined4 local_1b8;
  undefined4 local_1b4;
  undefined4 local_1b0;
  undefined4 local_1ac;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 local_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined4 local_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined4 local_150;
  undefined4 local_14c;
  undefined4 local_148;
  undefined4 local_144;
  ulong local_118;
  undefined1 *local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined1 *local_f8;
  ulong local_c8;
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  __atomic_base<unsigned_long> local_78;
  undefined1 *local_70;
  RTCDeviceRef *local_68;
  RTCScene local_60;
  undefined1 *local_58;
  Node *local_28;
  pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> *local_20;
  undefined8 local_18;
  undefined8 local_10;
  pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> *local_8;
  
  quality = (RTCBuildQuality)((ulong)in_stack_fffffffffffff568 >> 0x20);
  level = (float)((ulong)in_stack_fffffffffffff570 >> 0x20);
  fVar9 = (float)((ulong)in_stack_fffffffffffff540 >> 0x20);
  sse2 = (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20);
  local_619 = in_DL & 1;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff4af,
                          CONCAT16(in_stack_fffffffffffff4ae,
                                   CONCAT15(in_stack_fffffffffffff4ad,
                                            CONCAT14(in_stack_fffffffffffff4ac,
                                                     in_stack_fffffffffffff4a8)))),
                 (char *)in_stack_fffffffffffff4a0);
  stringOfISA_abi_cxx11_(sse2);
  std::operator+(in_stack_fffffffffffff4b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4b0);
  std::__cxx11::string::~string(local_680);
  std::__cxx11::string::~string(local_660);
  uVar1 = std::__cxx11::string::c_str();
  pRVar2 = (RTCDevice)rtcNewDevice(uVar1);
  RTCDeviceRef::RTCDeviceRef(local_698,pRVar2);
  pRVar2 = RTCDeviceRef::operator_cast_to_RTCDeviceTy_(local_698);
  rtcGetDeviceError(pRVar2);
  errorHandler(in_stack_fffffffffffff650,in_stack_fffffffffffff64c,in_stack_fffffffffffff640);
  local_6e0 = *(undefined8 *)(in_RDI + 0x40);
  VerifyScene::VerifyScene
            ((VerifyScene *)
             CONCAT17(in_stack_fffffffffffff4af,
                      CONCAT16(in_stack_fffffffffffff4ae,
                               CONCAT15(in_stack_fffffffffffff4ad,
                                        CONCAT14(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8
                                                )))),in_stack_fffffffffffff4a0,
             in_stack_fffffffffffff4b0);
  RTCDeviceRef::operator_cast_to_RTCDeviceTy_(local_698);
  AssertNoError(in_stack_fffffffffffff4d0);
  this_00 = (VerifyScene *)(in_RDI + 0x3c);
  local_5f8 = &local_718;
  local_5fc = 0xbf800000;
  local_600 = 0;
  local_604 = 0xbf800000;
  local_144 = 0;
  local_148 = 0xbf800000;
  local_14c = 0;
  local_150 = 0xbf800000;
  local_168 = 0xbf800000;
  uStack_160 = 0xbf800000;
  local_718 = 0xbf800000;
  uStack_710 = 0xbf800000;
  local_468 = local_738;
  local_730 = 0;
  local_728 = 0;
  local_720 = 0;
  VerifyScene::addSphere
            (in_stack_fffffffffffff560,in_stack_fffffffffffff558,
             (RTCBuildQuality)(in_stack_fffffffffffff550 >> 0x20),in_stack_fffffffffffff548,fVar9,
             in_stack_fffffffffffff538,CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0)
             ,(avector<Vec3fa> *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
  local_6f8.s = local_708;
  lVar13 = (long)&local_6f4;
  pRVar3 = (RandomSampler *)(in_RDI + 0x3c);
  local_5e0 = &local_758;
  local_5e4 = 0xbf800000;
  local_5e8 = 0;
  local_5ec = 0x3f800000;
  local_16c = 0;
  local_170 = 0x3f800000;
  local_174 = 0;
  local_178 = 0xbf800000;
  local_188 = 0xbf800000;
  uStack_180 = 0x3f800000;
  local_758 = 0xbf800000;
  uStack_750 = 0x3f800000;
  local_460 = local_778;
  local_770 = 0;
  local_768 = 0;
  local_760 = 0;
  VerifyScene::addQuadSphere
            (in_stack_fffffffffffff560,in_stack_fffffffffffff558,
             (RTCBuildQuality)(in_stack_fffffffffffff550 >> 0x20),in_stack_fffffffffffff548,fVar9,
             in_stack_fffffffffffff538,CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0)
             ,(avector<Vec3fa> *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
  *(undefined4 *)lVar13 = local_748;
  lVar12 = (long)&local_6f0;
  local_5c8 = (long)&local_7b8 + 0x20;
  local_5cc = 0x3f800000;
  local_5d0 = 0;
  local_5d4 = 0xbf800000;
  local_18c = 0;
  local_190 = 0xbf800000;
  local_194 = 0;
  local_198 = 0x3f800000;
  local_1a8 = 0x3f800000;
  uStack_1a0 = 0xbf800000;
  local_7b8.flags.sflags = 0x3f800000;
  local_7b8.flags.qflags = RTC_BUILD_QUALITY_LOW;
  local_7b8.nodes.
  super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xbf800000;
  local_458 = (undefined1 *)&local_7b8;
  local_7b8.super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  local_7b8.device = (RTCDeviceRef *)0x0;
  local_7b8.scene.scene = (RTCScene)0x0;
  this_02 = &local_7b8;
  VerifyScene::addSubdivSphere
            (this_00,pRVar3,(RTCBuildQuality)((ulong)lVar13 >> 0x20),(Vec3fa *)(in_RDI + 0x3c),
             (float)((ulong)lVar12 >> 0x20),in_stack_fffffffffffff578,level,
             in_stack_fffffffffffff660,
             (avector<Vec3fa> *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
  *(undefined4 *)lVar12 =
       local_7b8.nodes.
       super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_finish._0_4_;
  pRVar3 = &local_6ec;
  local_5b0 = &local_7d8;
  local_5b4 = 0x3f800000;
  local_5b8 = 0;
  local_5bc = 0x3f800000;
  local_1ac = 0;
  local_1b0 = 0x3f800000;
  local_1b4 = 0;
  local_1b8 = 0x3f800000;
  local_1c8 = 0x3f800000;
  uStack_1c0 = 0x3f800000;
  local_7d8 = 0x3f800000;
  uStack_7d0 = 0x3f800000;
  local_450 = &local_7f8;
  local_7f8.second.ptr = (Node *)0x0;
  local_7e8 = 0;
  local_7e0 = 0;
  this_01 = &local_7f8;
  VerifyScene::addHair
            ((VerifyScene *)(in_RDI + 0x3c),pRVar3,quality,(Vec3fa *)in_stack_fffffffffffff560,
             (float)((ulong)in_stack_fffffffffffff558 >> 0x20),SUB84(in_stack_fffffffffffff558,0),
             in_stack_fffffffffffff550,
             (avector<Vec3fa> *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670));
  pRVar3->s = local_7c8;
  std::pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_>::~pair(this_01);
  ppVar11 = &local_7f8;
  for (local_28 = (Node *)0x0; local_28 < local_7f8.second.ptr;
      local_28 = (Node *)((long)&(local_28->super_RefCount)._vptr_RefCount + 1)) {
  }
  local_18 = local_7e8;
  local_10 = local_7e0;
  local_448 = ppVar11;
  local_20 = ppVar11;
  local_8 = ppVar11;
  alignedFree(this_01);
  ppVar11[1].second.ptr = (Node *)0x0;
  *(undefined8 *)(ppVar11 + 1) = 0;
  (ppVar11->second).ptr = (Node *)0x0;
  std::pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_>::~pair(this_01);
  puVar10 = (undefined1 *)&local_7b8;
  for (local_78._M_i = 0;
      local_78._M_i <
      (ulong)local_7b8.super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      local_78._M_i = local_78._M_i + 1) {
  }
  local_68 = local_7b8.device;
  local_60 = local_7b8.scene.scene;
  local_438 = puVar10;
  local_70 = puVar10;
  local_58 = puVar10;
  alignedFree(this_01);
  *(undefined8 *)((long)puVar10 + 0x18) = 0;
  *(undefined8 *)((long)puVar10 + 0x10) = 0;
  *(undefined8 *)(puVar10 + 8) = 0;
  std::pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_>::~pair(this_01);
  puVar10 = local_778;
  for (local_c8 = 0; local_c8 < local_770; local_c8 = local_c8 + 1) {
  }
  local_b8 = local_768;
  local_b0 = local_760;
  local_428 = puVar10;
  local_c0 = puVar10;
  local_a8 = puVar10;
  alignedFree(this_01);
  *(undefined8 *)(puVar10 + 0x18) = 0;
  *(undefined8 *)(puVar10 + 0x10) = 0;
  *(undefined8 *)(puVar10 + 8) = 0;
  std::pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_>::~pair(this_01);
  puVar10 = local_738;
  for (local_118 = 0; local_118 < local_730; local_118 = local_118 + 1) {
  }
  local_108 = local_728;
  local_100 = local_720;
  local_418 = puVar10;
  local_110 = puVar10;
  local_f8 = puVar10;
  alignedFree(this_01);
  *(undefined8 *)(puVar10 + 0x18) = 0;
  *(undefined8 *)(puVar10 + 0x10) = 0;
  *(undefined8 *)(puVar10 + 8) = 0;
  pRVar4 = VerifyScene::operator_cast_to_RTCSceneTy_(&local_6d8);
  local_818[0] = rtcGetGeometry(pRVar4,local_6f8.s);
  pRVar4 = VerifyScene::operator_cast_to_RTCSceneTy_(&local_6d8);
  local_818[1] = rtcGetGeometry(pRVar4,local_6f4);
  pRVar4 = VerifyScene::operator_cast_to_RTCSceneTy_(&local_6d8);
  local_818[2] = rtcGetGeometry(pRVar4,local_6f0);
  pRVar4 = VerifyScene::operator_cast_to_RTCSceneTy_(&local_6d8);
  local_818[3] = rtcGetGeometry(pRVar4,local_6ec.s);
  RTCDeviceRef::operator_cast_to_RTCDeviceTy_(local_698);
  AssertNoError(in_stack_fffffffffffff4d0);
  for (local_820 = 0; local_820 < 4; local_820 = local_820 + 1) {
    rtcEnableGeometry(local_818[local_820]);
  }
  pRVar4 = VerifyScene::operator_cast_to_RTCSceneTy_(&local_6d8);
  rtcCommitScene(pRVar4);
  RTCDeviceRef::operator_cast_to_RTCDeviceTy_(local_698);
  AssertNoError((RTCDevice)pRVar4);
  local_821 = 1;
  for (local_830 = 0; local_830 < 5; local_830 = local_830 + 1) {
    local_598 = &local_8a8;
    local_59c = 0xbf800000;
    local_5a0 = 0x41200000;
    local_5a4 = 0xbf800000;
    local_1cc = 0;
    local_1d0 = 0xbf800000;
    local_1d4 = 0x41200000;
    local_1d8 = 0xbf800000;
    local_1e8 = 0x41200000bf800000;
    uStack_1e0 = 0xbf800000;
    local_8a8 = 0x41200000bf800000;
    uStack_8a0 = 0xbf800000;
    local_580 = &local_8b8;
    local_584 = 0;
    local_588 = 0xbf800000;
    local_58c = 0;
    local_1ec = 0;
    local_1f0 = 0;
    local_1f4 = 0xbf800000;
    local_1f8 = 0;
    local_208 = 0xbf80000000000000;
    uStack_200 = 0;
    local_8b8 = 0xbf80000000000000;
    uStack_8b0 = 0;
    local_478 = &local_8a8;
    local_480 = &local_8b8;
    local_400 = &local_898;
    local_2d0 = &zero;
    local_898 = 0;
    local_2d8 = &zero;
    local_894 = 0;
    local_2e0 = &zero;
    local_890 = 0;
    local_2e8 = &zero;
    local_888 = 0;
    local_2f0 = &zero;
    local_884 = 0;
    local_2f8 = &zero;
    local_880 = 0;
    local_3f8 = &pos_inf;
    fVar9 = std::numeric_limits<float>::infinity();
    local_400[3] = fVar9;
    local_3f0 = &neg_inf;
    fVar9 = std::numeric_limits<float>::infinity();
    local_400[8] = -fVar9;
    local_400[7] = 0;
    local_400[9] = 0xffffffff;
    local_400[10] = 0xffffffff;
    local_400[0xc] = 0;
    local_400[0xd] = 0;
    local_400[0xe] = 0;
    local_400[0xf] = 0;
    local_400[0x10] = 0;
    local_400[0x12] = 0xffffffff;
    local_400[0x11] = 0xffffffff;
    local_404 = 0;
    while (local_404 == 0) {
      local_400[0x13] = 0xffffffff;
      local_400[0x14] = 0xffffffff;
      local_404 = 1;
    }
    local_898 = *(undefined4 *)local_478;
    local_894 = *(undefined4 *)((long)local_478 + 4);
    local_890 = *(undefined4 *)(local_478 + 1);
    local_888 = *(undefined4 *)local_480;
    local_884 = *(undefined4 *)((long)local_480 + 4);
    local_880 = *(undefined4 *)(local_480 + 1);
    local_88c = 0;
    local_470 = &inf;
    local_878 = std::numeric_limits<float>::infinity();
    local_87c = 0;
    local_874 = 0xffffffff;
    local_854 = 0xffffffff;
    local_850 = -1;
    local_484 = 0;
    while (local_484 == 0) {
      uStack_84c = 0xffffffff;
      uStack_848 = 0xffffffff;
      local_484 = 1;
    }
    local_568 = &local_928;
    local_56c = 0xbf800000;
    local_570 = 0x41200000;
    local_574 = 0x3f800000;
    local_20c = 0;
    local_210 = 0x3f800000;
    local_214 = 0x41200000;
    local_218 = 0xbf800000;
    local_228 = 0x41200000bf800000;
    uStack_220 = 0x3f800000;
    local_928 = 0x41200000bf800000;
    uStack_920 = 0x3f800000;
    local_550 = &local_938;
    local_554 = 0;
    local_558 = 0xbf800000;
    local_55c = 0;
    local_22c = 0;
    local_230 = 0;
    local_234 = 0xbf800000;
    local_238 = 0;
    local_248 = 0xbf80000000000000;
    uStack_240 = 0;
    local_938 = 0xbf80000000000000;
    uStack_930 = 0;
    local_498 = &local_928;
    local_4a0 = &local_938;
    local_3e0 = &local_918;
    local_300 = &zero;
    local_918 = 0;
    local_308 = &zero;
    local_914 = 0;
    local_310 = &zero;
    local_910 = 0;
    local_318 = &zero;
    local_908 = 0;
    local_320 = &zero;
    local_904 = 0;
    local_328 = &zero;
    local_900 = 0;
    local_3d8 = &pos_inf;
    fVar9 = std::numeric_limits<float>::infinity();
    local_3e0[3] = fVar9;
    local_3d0 = &neg_inf;
    fVar9 = std::numeric_limits<float>::infinity();
    local_3e0[8] = -fVar9;
    local_3e0[7] = 0;
    local_3e0[9] = 0xffffffff;
    local_3e0[10] = 0xffffffff;
    local_3e0[0xc] = 0;
    local_3e0[0xd] = 0;
    local_3e0[0xe] = 0;
    local_3e0[0xf] = 0;
    local_3e0[0x10] = 0;
    local_3e0[0x12] = 0xffffffff;
    local_3e0[0x11] = 0xffffffff;
    local_3e4 = 0;
    while (local_3e4 == 0) {
      local_3e0[0x13] = 0xffffffff;
      local_3e0[0x14] = 0xffffffff;
      local_3e4 = 1;
    }
    local_918 = *(undefined4 *)local_498;
    local_914 = *(undefined4 *)((long)local_498 + 4);
    local_910 = *(undefined4 *)(local_498 + 1);
    local_908 = *(undefined4 *)local_4a0;
    local_904 = *(undefined4 *)((long)local_4a0 + 4);
    local_900 = *(undefined4 *)(local_4a0 + 1);
    local_90c = 0;
    local_490 = &inf;
    local_8f8 = std::numeric_limits<float>::infinity();
    local_8fc = 0;
    local_8f4 = 0xffffffff;
    local_8d4 = 0xffffffff;
    local_8d0 = -1;
    local_4a4 = 0;
    while (local_4a4 == 0) {
      uStack_8cc = 0xffffffff;
      uStack_8c8 = 0xffffffff;
      local_4a4 = 1;
    }
    local_538 = &local_9a8;
    local_53c = 0x3f800000;
    local_540 = 0x41200000;
    local_544 = 0xbf800000;
    local_24c = 0;
    local_250 = 0xbf800000;
    local_254 = 0x41200000;
    local_258 = 0x3f800000;
    local_268 = 0x412000003f800000;
    uStack_260 = 0xbf800000;
    local_9a8 = 0x412000003f800000;
    local_520 = local_9b8;
    local_524 = 0;
    local_528 = 0xbf800000;
    local_52c = 0;
    local_26c = 0;
    local_270 = 0;
    local_274 = 0xbf800000;
    local_278 = 0;
    local_288 = 0xbf80000000000000;
    uStack_280 = 0;
    local_4b8 = &local_9a8;
    local_4c0 = local_9b8;
    local_3c0 = &stack0xfffffffffffff668;
    local_330 = &zero;
    local_338 = &zero;
    local_340 = &zero;
    local_348 = &zero;
    local_350 = &zero;
    local_358 = &zero;
    local_3b8 = &pos_inf;
    fVar9 = std::numeric_limits<float>::infinity();
    *(float *)(local_3c0 + 0xc) = fVar9;
    local_3b0 = &neg_inf;
    fVar9 = std::numeric_limits<float>::infinity();
    *(float *)(local_3c0 + 0x20) = -fVar9;
    *(undefined4 *)(local_3c0 + 0x1c) = 0;
    *(undefined4 *)(local_3c0 + 0x24) = 0xffffffff;
    *(undefined4 *)(local_3c0 + 0x28) = 0xffffffff;
    *(undefined4 *)(local_3c0 + 0x30) = 0;
    *(undefined4 *)(local_3c0 + 0x34) = 0;
    *(undefined4 *)(local_3c0 + 0x38) = 0;
    *(undefined4 *)(local_3c0 + 0x3c) = 0;
    *(undefined4 *)(local_3c0 + 0x40) = 0;
    *(undefined4 *)(local_3c0 + 0x48) = 0xffffffff;
    *(undefined4 *)(local_3c0 + 0x44) = 0xffffffff;
    local_3c4 = 0;
    while (local_3c4 == 0) {
      *(undefined4 *)(local_3c0 + 0x4c) = 0xffffffff;
      *(undefined4 *)(local_3c0 + 0x50) = 0xffffffff;
      local_3c4 = 1;
    }
    local_4b0 = &inf;
    std::numeric_limits<float>::infinity();
    local_4c4 = 0;
    while (local_4c4 == 0) {
      local_4c4 = 1;
    }
    local_508 = &local_a28;
    local_50c = 0x3f800000;
    local_510 = 0x41200000;
    local_514 = 0x3f800000;
    local_28c = 0;
    local_290 = 0x3f800000;
    local_294 = 0x41200000;
    local_298 = 0x3f800000;
    local_2a8 = 0x412000003f800000;
    uStack_2a0 = 0x3f800000;
    local_a28 = 0x412000003f800000;
    uStack_a20 = 0x3f800000;
    local_4f0 = &local_a38;
    local_4f4 = 0;
    local_4f8 = 0xbf800000;
    local_4fc = 0;
    local_2ac = 0;
    local_2b0 = 0;
    local_2b4 = 0xbf800000;
    local_2b8 = 0;
    local_2c8 = 0xbf80000000000000;
    uStack_2c0 = 0;
    local_a38 = 0xbf80000000000000;
    uStack_a30 = 0;
    local_4d8 = &local_a28;
    local_4e0 = &local_a38;
    local_3a0 = &local_a18;
    local_360 = &zero;
    local_a18 = 0;
    local_368 = &zero;
    local_a14 = 0;
    local_370 = &zero;
    local_378 = &zero;
    local_380 = &zero;
    local_388 = &zero;
    local_398 = &pos_inf;
    fVar9 = std::numeric_limits<float>::infinity();
    local_3a0[3] = fVar9;
    local_390 = &neg_inf;
    fVar9 = std::numeric_limits<float>::infinity();
    local_3a0[8] = -fVar9;
    local_3a0[7] = 0;
    local_3a0[9] = 0xffffffff;
    local_3a0[10] = 0xffffffff;
    local_3a0[0xc] = 0;
    local_3a0[0xd] = 0;
    local_3a0[0xe] = 0;
    local_3a0[0xf] = 0;
    local_3a0[0x10] = 0;
    local_3a0[0x12] = 0xffffffff;
    local_3a0[0x11] = 0xffffffff;
    local_3a4 = 0;
    while (local_3a4 == 0) {
      local_3a0[0x13] = 0xffffffff;
      local_3a0[0x14] = 0xffffffff;
      local_3a4 = 1;
    }
    local_a18 = *(undefined4 *)local_4d8;
    local_a14 = *(undefined4 *)((long)local_4d8 + 4);
    local_4d0 = &inf;
    std::numeric_limits<float>::infinity();
    local_4e4 = 0;
    while (local_4e4 == 0) {
      local_4e4 = 1;
    }
    pRVar5 = VerifyScene::operator_cast_to_RTCSceneTy_(&local_6d8);
    rtcIntersect1(pRVar5,&local_898,0);
    pRVar5 = VerifyScene::operator_cast_to_RTCSceneTy_(&local_6d8);
    rtcIntersect1(pRVar5,&local_918,0);
    pRVar5 = VerifyScene::operator_cast_to_RTCSceneTy_(&local_6d8);
    rtcIntersect1(pRVar5,&stack0xfffffffffffff668,0);
    pRVar5 = VerifyScene::operator_cast_to_RTCSceneTy_(&local_6d8);
    rtcIntersect1(pRVar5,&local_a18,0);
    if (local_830 == 0) {
      bVar7 = local_850 == 0;
    }
    else {
      bVar7 = local_850 == -1;
    }
    if (local_830 < 2) {
      bVar8 = local_8d0 == 1;
    }
    else {
      bVar8 = local_8d0 == -1;
    }
    if ((((bVar7) && (bVar8)) && (2 < local_830)) && (3 < local_830)) {
      poVar6 = std::operator<<((ostream *)&std::cout,".");
      std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cout,"!");
      std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
      local_821 = 0;
    }
    if (local_830 < 4) {
      rtcDisableGeometry(local_818[local_830]);
      RTCDeviceRef::operator_cast_to_RTCDeviceTy_(local_698);
      AssertNoError((RTCDevice)pRVar4);
      pRVar5 = VerifyScene::operator_cast_to_RTCSceneTy_(&local_6d8);
      rtcDetachGeometry(pRVar5,(&local_6f8)[local_830].s);
      RTCDeviceRef::operator_cast_to_RTCDeviceTy_(local_698);
      AssertNoError((RTCDevice)pRVar4);
      pRVar5 = VerifyScene::operator_cast_to_RTCSceneTy_(&local_6d8);
      rtcCommitScene(pRVar5);
      RTCDeviceRef::operator_cast_to_RTCDeviceTy_(local_698);
      AssertNoError((RTCDevice)pRVar4);
    }
  }
  RTCDeviceRef::operator_cast_to_RTCDeviceTy_(local_698);
  AssertNoError((RTCDevice)pRVar4);
  local_608 = (TestReturnValue)((local_821 & 1) != 0);
  VerifyScene::~VerifyScene(this_02);
  RTCDeviceRef::~RTCDeviceRef((RTCDeviceRef *)this_02);
  std::__cxx11::string::~string(local_640);
  return local_608;
}

Assistant:

VerifyApplication::TestReturnValue run(VerifyApplication* state, bool silent)
    {
      std::string cfg = state->rtcore + ",isa="+stringOfISA(isa);
      RTCDeviceRef device = rtcNewDevice(cfg.c_str());
      errorHandler(nullptr,rtcGetDeviceError(device));
      VerifyScene scene(device,sflags);
      AssertNoError(device);
      unsigned geom[] = {
        scene.addSphere      (sampler,RTC_BUILD_QUALITY_MEDIUM,Vec3fa(-1,0,-1),1.0f,50).first,
        scene.addQuadSphere  (sampler,RTC_BUILD_QUALITY_MEDIUM,Vec3fa(-1,0,+1),1.0f,50).first,
        scene.addSubdivSphere(sampler,RTC_BUILD_QUALITY_MEDIUM,Vec3fa(+1,0,-1),1.0f,5,4).first,
        scene.addHair        (sampler,RTC_BUILD_QUALITY_MEDIUM,Vec3fa(+1,0,+1),1.0f,1.0f,1).first,
      };
      RTCGeometry hgeom[] = {
        rtcGetGeometry(scene,geom[0]),
        rtcGetGeometry(scene,geom[1]),
        rtcGetGeometry(scene,geom[2]),
        rtcGetGeometry(scene,geom[3]),
      };
      AssertNoError(device);

      for (size_t j=0; j<4; ++j)
      {
        rtcEnableGeometry(hgeom[j]);
      }
      rtcCommitScene (scene);
      AssertNoError(device);

      bool allOk = true;
      for (size_t i=0; i<5; i++)
      {
        RTCRayHit ray0 = makeRay(Vec3fa(-1,10,-1),Vec3fa(0,-1,0));
        RTCRayHit ray1 = makeRay(Vec3fa(-1,10,+1),Vec3fa(0,-1,0));
        RTCRayHit ray2 = makeRay(Vec3fa(+1,10,-1),Vec3fa(0,-1,0));
        RTCRayHit ray3 = makeRay(Vec3fa(+1,10,+1),Vec3fa(0,-1,0));
        rtcIntersect1(scene,&ray0);
        rtcIntersect1(scene,&ray1);
        rtcIntersect1(scene,&ray2);
        rtcIntersect1(scene,&ray3);
        bool ok0 = i<=0 ? ray0.hit.geomID == 0 : ray0.hit.geomID == RTC_INVALID_GEOMETRY_ID;
        bool ok1 = i<=1 ? ray1.hit.geomID == 1 : ray1.hit.geomID == RTC_INVALID_GEOMETRY_ID;
        bool ok2 = i<=2 ? ray2.hit.geomID == 2 : ray2.hit.geomID == RTC_INVALID_GEOMETRY_ID;
        bool ok3 = i<=3 ? ray3.hit.geomID == 3 : ray3.hit.geomID == RTC_INVALID_GEOMETRY_ID;
        if (!ok0 || !ok1 || !ok2 || !ok3)
        {
          std::cout << "!" << std::flush;
          allOk = false;
        }
        else
        {
          std::cout << "." << std::flush;
        }

        if (i<4)
        {
          rtcDisableGeometry(hgeom[i]);
          AssertNoError(device);
          rtcDetachGeometry(scene,geom[i]);
          AssertNoError(device);
          rtcCommitScene (scene);
          AssertNoError(device);
        }
      }
      AssertNoError(device);

      if (allOk)
        return VerifyApplication::PASSED;
      else
        return VerifyApplication::FAILED;
    }